

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall
llm_tokenizer_wpm_session::tokenize
          (llm_tokenizer_wpm_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  pointer piVar1;
  long lVar2;
  llama_vocab *this_00;
  iterator __position;
  iterator __position_00;
  int iVar3;
  llama_token lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  llama_token id;
  string word1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  llama_token local_bc;
  vector<int,std::allocator<int>> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_type local_90;
  size_type local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  preprocess(&local_48,text);
  local_80 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_b8 = (vector<int,std::allocator<int>> *)output;
    do {
      if ((local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 0) {
        local_70 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        std::operator+(&local_b0,anon_var_dwarf_3afc8e,
                       local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        piVar1 = *(pointer *)((long)output + 8);
        lVar2 = *(long *)output;
        if (0 < (int)(uint)local_b0._M_string_length) {
          local_88 = (long)piVar1 - lVar2 >> 2;
          local_78 = (ulong)((uint)local_b0._M_string_length & 0x7fffffff);
          uVar7 = 0;
          local_90 = local_b0._M_string_length;
          do {
            iVar6 = (int)uVar7;
            iVar3 = ((this->vocab->pimpl)._M_t.
                     super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                     .super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl)->max_token_len
                    + iVar6 + 1;
            iVar5 = (int)local_90;
            if (iVar3 < (int)local_90) {
              iVar5 = iVar3;
            }
            if (iVar5 <= iVar6) {
LAB_00219936:
              output = (vector<int,_std::allocator<int>_> *)local_b8;
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)local_b8,local_88);
              break;
            }
            uVar7 = (long)iVar3;
            if ((long)local_78 <= (long)iVar3) {
              uVar7 = local_78;
            }
            while( true ) {
              this_00 = this->vocab;
              std::__cxx11::string::substr((ulong)&local_68,(ulong)&local_b0);
              lVar4 = llama_vocab::text_to_token(this_00,&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_68._M_dataplus._M_p._4_4_,(int)local_68._M_dataplus._M_p) !=
                  &local_68.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_68._M_dataplus._M_p._4_4_,
                                         (int)local_68._M_dataplus._M_p),
                                local_68.field_2._M_allocated_capacity + 1);
              }
              output = (vector<int,_std::allocator<int>_> *)local_b8;
              local_bc = lVar4;
              if (lVar4 != -1) break;
              uVar7 = uVar7 - 1;
              if ((long)uVar7 <= (long)iVar6) goto LAB_00219936;
            }
            __position._M_current = *(int **)(local_b8 + 8);
            if (__position._M_current == *(int **)(local_b8 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_b8,__position,&local_bc);
            }
            else {
              *__position._M_current = lVar4;
              *(int **)(local_b8 + 8) = __position._M_current + 1;
            }
          } while ((int)uVar7 < (int)local_90);
        }
        __position_00._M_current = *(int **)((long)output + 8);
        if ((long)piVar1 - lVar2 == (long)__position_00._M_current - *(long *)output) {
          local_68._M_dataplus._M_p._0_4_ =
               ((this->vocab->pimpl)._M_t.
                super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>.
                _M_t.
                super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                .super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl)->special_unk_id;
          if (__position_00._M_current == *(int **)((long)output + 0x10)) {
            llama_vocab::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (output,__position_00,(int *)&local_68);
          }
          else {
            *__position_00._M_current = (int)local_68._M_dataplus._M_p;
            *(int **)((long)output + 8) = __position_00._M_current + 1;
          }
        }
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_70;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_70;
        }
      }
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
    } while (local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_80);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        // normalize and split by whitespace
        std::vector<std::string> words = preprocess(text);
        // bos token prepended already

        // find the longest tokens that form the words
        for (const std::string & word : words) {
            // skip empty words
            if (word.size() == 0) {
                continue;
            }

            // prepend phantom space
            const std::string word1 = "\xe2\x96\x81" + word;
            const int n = word1.size();

            const size_t current_tokens = output.size();

            // we're at the start of a new word
            // move through character position in word
            for (int i = 0; i < n; ++i) {
                // loop through possible match length
                bool match = false;
                for (int j = std::min(n, i + vocab.max_token_len() + 1); j > i; j--) {
                    auto id = vocab.text_to_token(word1.substr(i, j - i));
                    if (id != LLAMA_TOKEN_NULL) {
                        output.push_back(id);
                        match = true;
                        i = j - 1;
                        break;
                    }
                }

                if (!match) { // discard all
                    output.resize(current_tokens);
                    break;  // and discard next tokens
                }
            }

            // we didn't find any matches for this word
            if (current_tokens == output.size()) {
                output.push_back(vocab.token_unk());
            }
        }
    }